

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::StableSign(S2Point *a,S2Point *b,S2Point *c)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_58 = b->c_[2] - a->c_[2];
  local_68 = b->c_[0] - a->c_[0];
  dStack_60 = b->c_[1] - a->c_[1];
  local_98 = a->c_[2] - c->c_[2];
  local_78 = c->c_[2] - b->c_[2];
  local_a8 = a->c_[0] - c->c_[0];
  dStack_a0 = a->c_[1] - c->c_[1];
  local_88 = c->c_[0] - b->c_[0];
  dStack_80 = c->c_[1] - b->c_[1];
  dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_68);
  dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_88);
  dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_a8);
  if ((dVar2 < dVar3) || (dVar2 < dVar4)) {
    if (dVar3 < dVar4) {
      local_48 = local_58 * dStack_80 - local_78 * dStack_60;
      dStack_40 = local_68 * local_78 - local_88 * local_58;
      local_38 = dStack_60 * local_88 - dStack_80 * local_68;
      dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)&local_48,b);
      dVar2 = dVar3 * dVar2;
      goto LAB_0024ed71;
    }
    local_48 = local_98 * dStack_60 - local_58 * dStack_a0;
    dStack_40 = local_a8 * local_58 - local_68 * local_98;
    local_38 = dStack_a0 * local_68 - dStack_60 * local_a8;
    dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)&local_48,a);
  }
  else {
    local_48 = local_78 * dStack_a0 - local_98 * dStack_80;
    dStack_40 = local_88 * local_98 - local_a8 * local_78;
    local_38 = dStack_80 * local_a8 - dStack_a0 * local_88;
    dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)&local_48,c);
    dVar2 = dVar3;
  }
  dVar2 = dVar2 * dVar4;
LAB_0024ed71:
  dVar5 = -dVar5;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  iVar1 = ((0.0 < dVar5) - 1) + (uint)(0.0 < dVar5);
  if (ABS(dVar5) <= dVar2 * 7.176703675781937e-16) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int StableSign(const S2Point& a, const S2Point& b, const S2Point& c) {
  Vector3_d ab = b - a;
  Vector3_d bc = c - b;
  Vector3_d ca = a - c;
  double ab2 = ab.Norm2();
  double bc2 = bc.Norm2();
  double ca2 = ca.Norm2();

  // Now compute the determinant ((A-C)x(B-C)).C, where the vertices have been
  // cyclically permuted if necessary so that AB is the longest edge.  (This
  // minimizes the magnitude of cross product.)  At the same time we also
  // compute the maximum error in the determinant.  Using a similar technique
  // to the one used for kMaxDetError, the error is at most
  //
  //   |d| <= (3 + 6/sqrt(3)) * |A-C| * |B-C| * e
  //
  // where e = 0.5 * DBL_EPSILON.  If the determinant magnitude is larger than
  // this value then we know its sign with certainty.
  const double kDetErrorMultiplier = 3.2321 * DBL_EPSILON;  // see above
  double det, max_error;
  if (ab2 >= bc2 && ab2 >= ca2) {
    // AB is the longest edge, so compute (A-C)x(B-C).C.
    det = -(ca.CrossProd(bc).DotProd(c));
    max_error = kDetErrorMultiplier * sqrt(ca2 * bc2);
  } else if (bc2 >= ca2) {
    // BC is the longest edge, so compute (B-A)x(C-A).A.
    det = -(ab.CrossProd(ca).DotProd(a));
    max_error = kDetErrorMultiplier * sqrt(ab2 * ca2);
  } else {
    // CA is the longest edge, so compute (C-B)x(A-B).B.
    det = -(bc.CrossProd(ab).DotProd(b));
    max_error = kDetErrorMultiplier * sqrt(bc2 * ab2);
  }
  return (fabs(det) <= max_error) ? 0 : (det > 0) ? 1 : -1;
}